

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsourcedata.cpp
# Opt level: O3

RTPTime __thiscall jrtplib::RTPSourceData::INF_GetRoundtripTime(RTPSourceData *this)

{
  double dVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  RTPTime RVar5;
  
  RVar5.m_t = 0.0;
  if ((this->RRinf).hasinfo == true) {
    uVar2 = (this->RRinf).lsr;
    uVar3 = (this->RRinf).dlsr;
    if (uVar3 != 0 || uVar2 != 0) {
      dVar1 = (this->RRinf).receivetime.m_t;
      uVar4 = (ulong)dVar1;
      RVar5.m_t = (double)(((uint)(long)(((double)((long)((dVar1 - (double)(uVar4 & 0xffffffff)) *
                                                         1000000.0) & 0xffffffff) / 1000000.0) *
                                        4294967296.0) >> 0x10 | ((int)uVar4 + 0x7e80) * 0x10000) -
                          (uVar2 + uVar3)) * 1.52587890625e-05;
    }
  }
  return (RTPTime)RVar5.m_t;
}

Assistant:

RTPTime RTPSourceData::INF_GetRoundtripTime() const
{
	if (!RRinf.HasInfo())
		return RTPTime(0,0);
	if (RRinf.GetDelaySinceLastSR() == 0 && RRinf.GetLastSRTimestamp() == 0)
		return RTPTime(0,0);

	RTPNTPTime recvtime = RRinf.GetReceiveTime().GetNTPTime();
	uint32_t rtt = ((recvtime.GetMSW()&0xFFFF)<<16)|((recvtime.GetLSW()>>16)&0xFFFF);
	rtt -= RRinf.GetLastSRTimestamp();
	rtt -= RRinf.GetDelaySinceLastSR();

	double drtt = (((double)rtt)/65536.0);
	return RTPTime(drtt);
}